

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> __thiscall
wallet::SQLiteBatch::GetNewCursor(SQLiteBatch *this)

{
  undefined8 uVar1;
  int iVar2;
  pointer pSVar3;
  runtime_error *this_00;
  long in_RSI;
  _Head_base<0UL,_wallet::DatabaseCursor_*,_false> in_RDI;
  long in_FS_OFFSET;
  int res;
  char *stmt_text;
  __single_object cursor;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
  *in_stack_ffffffffffffff48;
  unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>
  *in_stack_ffffffffffffff50;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff78;
  int iVar4;
  _Head_base<0UL,_wallet::DatabaseCursor_*,_false> fmt;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(in_RSI + 8) + 200) == 0) {
    std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>::
    unique_ptr<std::default_delete<wallet::DatabaseCursor>,void>
              (in_stack_ffffffffffffff48,(nullptr_t)0x17ad789);
    fmt._M_head_impl = in_RDI._M_head_impl;
  }
  else {
    fmt._M_head_impl = in_RDI._M_head_impl;
    std::make_unique<wallet::SQLiteCursor>();
    uVar1 = *(undefined8 *)(*(long *)(in_RSI + 8) + 200);
    pSVar3 = std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::
             operator->((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>
                         *)in_stack_ffffffffffffff48);
    iVar2 = sqlite3_prepare_v2(uVar1,"SELECT key, value FROM main",0xffffffff,&pSVar3->m_cursor_stmt
                               ,0);
    if (iVar2 != 0) {
      iVar4 = iVar2;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      sqlite3_errstr(iVar2);
      tinyformat::format<char[13],char_const*>
                ((char *)fmt._M_head_impl,(char (*) [13])in_RDI._M_head_impl,
                 (char **)CONCAT44(iVar4,in_stack_ffffffffffffff78));
      std::runtime_error::runtime_error(this_00,local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_017ad98b;
    }
    std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>::
    unique_ptr<wallet::SQLiteCursor,std::default_delete<wallet::SQLiteCursor>,void>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_>::~unique_ptr
              ((unique_ptr<wallet::SQLiteCursor,_std::default_delete<wallet::SQLiteCursor>_> *)
               in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
            )(tuple<wallet::DatabaseCursor_*,_std::default_delete<wallet::DatabaseCursor>_>)
             fmt._M_head_impl;
  }
LAB_017ad98b:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DatabaseCursor> SQLiteBatch::GetNewCursor()
{
    if (!m_database.m_db) return nullptr;
    auto cursor = std::make_unique<SQLiteCursor>();

    const char* stmt_text = "SELECT key, value FROM main";
    int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, &cursor->m_cursor_stmt, nullptr);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf(
            "%s: Failed to setup cursor SQL statement: %s\n", __func__, sqlite3_errstr(res)));
    }

    return cursor;
}